

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManAreFindBestVar(Gia_ManAre_t *p,Gia_PtrAre_t List)

{
  Gia_StaAre_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_StaAre_t *pS;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_5c;
  int local_58;
  
  iVar2 = p->pAig->nRegs;
  iVar7 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar3 = -1;
  local_5c = -1;
  for (; iVar7 != iVar2; iVar7 = iVar7 + 1) {
    pGVar1 = (Gia_StaAre_t *)*p->ppStas;
    bVar4 = (byte)(iVar7 * 2);
    iVar8 = 0;
    iVar5 = 0;
    local_58 = 0;
    for (pS = (Gia_StaAre_t *)
              (p->ppStas[(uint)List >> 0x14 & 0x7ff] +
              (long)p->nSize * (ulong)((uint)List & 0xfffff)); pGVar1 != pS; pS = Gia_StaNext(p,pS))
    {
      if (-1 < (int)pS->iPrev) {
        if (((uint)(&pS[1].iPrev)[iVar7 * 2 >> 5] & 1 << (bVar4 & 0x1f)) == 0) {
          if ((2 << (bVar4 & 0x1f) & (uint)(&pS[1].iPrev)[iVar7 * 2 >> 5]) == 0) {
            local_58 = local_58 + 1;
          }
          else {
            iVar5 = iVar5 + 1;
          }
        }
        else {
          iVar8 = iVar8 + 1;
        }
      }
    }
    if ((iVar8 != 0 || iVar5 != 0) && (iVar8 != 0 && iVar5 != 0 || local_58 != 0)) {
      iVar6 = iVar8 - iVar5;
      if (iVar8 - iVar5 != 0 && iVar5 <= iVar8) {
        iVar6 = -(iVar8 - iVar5);
      }
      iVar6 = iVar5 + iVar8 + iVar6;
      if (local_5c < iVar6) {
        iVar3 = iVar7;
      }
      if (local_5c <= iVar6) {
        local_5c = iVar6;
      }
    }
  }
  if (iVar3 == -1) {
    Gia_ManArePrintListUsed(p,List);
    puts("Error: Best variable not found!!!");
    __assert_fail("iVarBest != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                  ,0x378,"int Gia_ManAreFindBestVar(Gia_ManAre_t *, Gia_PtrAre_t)");
  }
  return iVar3;
}

Assistant:

int Gia_ManAreFindBestVar( Gia_ManAre_t * p, Gia_PtrAre_t List )
{
    Gia_StaAre_t * pCube;
    int Count0, Count1, Count2;
    int iVarThis, iVarBest = -1, WeightThis, WeightBest = -1;
    for ( iVarThis = 0; iVarThis < Gia_ManRegNum(p->pAig); iVarThis++ )
    {
        Count0 = Count1 = Count2 = 0;
        Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, List), pCube )
        {
            if ( Gia_StaIsUnused(pCube) )
                continue;
            if ( Gia_StaHasValue0(pCube, iVarThis) )
                Count0++;
            else if ( Gia_StaHasValue1(pCube, iVarThis) )
                Count1++;
            else
                Count2++;
        }
//        printf( "%4d : %5d  %5d  %5d   Weight = %5d\n", iVarThis, Count0, Count1, Count2, 
//            Count0 + Count1 - (Count0 > Count1 ? Count0 - Count1 : Count1 - Count0) );
        if ( (!Count0 && !Count1) || (!Count0 && !Count2) || (!Count1 && !Count2) )
            continue;
        WeightThis = Count0 + Count1 - (Count0 > Count1 ? Count0 - Count1 : Count1 - Count0);
        if ( WeightBest < WeightThis ) 
        {
            WeightBest = WeightThis;
            iVarBest = iVarThis;
        }
    }
    if ( iVarBest == -1 )
    {
        Gia_ManArePrintListUsed( p, List );
        printf( "Error: Best variable not found!!!\n" );
    }
    assert( iVarBest != -1 );
    return iVarBest;
}